

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int recv_message(void)

{
  uint uVar1;
  sockaddr_in addr_from;
  sockaddr_in addr_from_00;
  sockaddr_in addr_from_01;
  int iVar2;
  ssize_t sVar3;
  const_iterator cVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  _Rb_tree_header *p_Var8;
  long lVar9;
  mapped_type_conflict *pmVar10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  uint uVar13;
  uchar __k [8];
  sockaddr_in addr_00;
  int current_id;
  int id_message;
  sockaddr_in addr;
  Ip_Port ip_port;
  socklen_t addr_size;
  int local_40;
  uint local_3c;
  sockaddr local_38;
  key_type local_28;
  socklen_t local_1c;
  
  local_1c = 0x10;
  sVar3 = recvfrom(socket_fd,buf,1000000,0,&local_38,&local_1c);
  iVar2 = rand();
  if (iVar2 % 99 + 1 < precent_lose) {
    fprintf(_stderr,"Bwahaha you just lose new message: %d\n");
    return 0;
  }
  local_28.second = local_38.sa_data._0_2_;
  cVar4 = std::
          _Rb_tree<std::pair<unsigned_int,_unsigned_short>,_std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
          ::find(&idconnections._M_t,&local_28);
  iVar2 = global_map_id;
  if ((_Rb_tree_header *)cVar4._M_node == &idconnections._M_t._M_impl.super__Rb_tree_header) {
    pmVar5 = std::
             map<std::pair<unsigned_int,_unsigned_short>,_int,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
             ::operator[](&idconnections,&local_28);
    *pmVar5 = iVar2;
    pmVar6 = std::
             map<int,_sockaddr_in,_std::less<int>,_std::allocator<std::pair<const_int,_sockaddr_in>_>_>
             ::operator[](&connections,&global_map_id);
    *(undefined4 *)pmVar6 = local_38._0_4_;
    (pmVar6->sin_addr).s_addr = local_38.sa_data._2_4_;
    *(undefined4 *)pmVar6->sin_zero = local_38.sa_data._6_4_;
    *(undefined4 *)(pmVar6->sin_zero + 4) = local_38.sa_data._10_4_;
    local_40 = global_map_id;
    global_map_id = global_map_id + 1;
  }
  else {
    pmVar5 = std::
             map<std::pair<unsigned_int,_unsigned_short>,_int,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
             ::operator[](&idconnections,&local_28);
    local_40 = *pmVar5;
  }
  if (sVar3 < 4) {
    recv_message();
    return -1;
  }
  uVar1 = *buf;
  uVar13 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = *(uint *)((long)buf + 4);
  local_3c = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  fprintf(_stderr,"Type message: %d\n",(ulong)uVar13);
  pmVar7 = std::
           map<int,_std::map<int,_long_long,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_long_long,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>_>_>_>
           ::operator[](&received_messages,&local_40);
  p_Var8 = &(pmVar7->_M_t)._M_impl.super__Rb_tree_header;
  p_Var12 = (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var11 = &p_Var8->_M_header;
  for (; p_Var12 != (_Base_ptr)0x0;
      p_Var12 = (&p_Var12->_M_left)[(int)p_Var12[1]._M_color < (int)local_3c]) {
    if ((int)local_3c <= (int)p_Var12[1]._M_color) {
      p_Var11 = p_Var12;
    }
  }
  p_Var12 = &p_Var8->_M_header;
  if (((_Rb_tree_header *)p_Var11 != p_Var8) &&
     (p_Var12 = p_Var11, (int)local_3c < (int)p_Var11[1]._M_color)) {
    p_Var12 = &p_Var8->_M_header;
  }
  if ((_Rb_tree_header *)p_Var12 != p_Var8) {
    return 0;
  }
  lVar9 = std::chrono::_V2::system_clock::now();
  pmVar7 = std::
           map<int,_std::map<int,_long_long,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_long_long,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>_>_>_>
           ::operator[](&received_messages,&local_40);
  __k = (uchar  [8])&local_3c;
  pmVar10 = std::
            map<int,_long_long,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>::
            operator[](pmVar7,(key_type *)__k);
  *pmVar10 = lVar9 / 1000;
  switch(uVar13) {
  case 0:
    erase_message_from_maps((pair<int,_int>)0x103ba1);
    return 1;
  case 1:
    addr_00.sin_addr.s_addr._0_1_ = local_38.sa_data[2];
    addr_00.sin_addr.s_addr._1_1_ = local_38.sa_data[3];
    addr_00.sin_addr.s_addr._2_1_ = local_38.sa_data[4];
    addr_00.sin_addr.s_addr._3_1_ = local_38.sa_data[5];
    addr_00._0_4_ = local_38._0_4_;
    addr_00.sin_zero[0] = __k[0];
    addr_00.sin_zero[1] = __k[1];
    addr_00.sin_zero[2] = __k[2];
    addr_00.sin_zero[3] = __k[3];
    addr_00.sin_zero[4] = __k[4];
    addr_00.sin_zero[5] = __k[5];
    addr_00.sin_zero[6] = __k[6];
    addr_00.sin_zero[7] = __k[7];
    iVar2 = handle_message(addr_00,local_40);
    if (iVar2 == 0) {
      return 1;
    }
    break;
  case 2:
    addr_from.sin_addr.s_addr._0_1_ = local_38.sa_data[2];
    addr_from.sin_addr.s_addr._1_1_ = local_38.sa_data[3];
    addr_from.sin_addr.s_addr._2_1_ = local_38.sa_data[4];
    addr_from.sin_addr.s_addr._3_1_ = local_38.sa_data[5];
    addr_from._0_4_ = local_38._0_4_;
    addr_from.sin_zero[0] = local_38.sa_data[6];
    addr_from.sin_zero[1] = local_38.sa_data[7];
    addr_from.sin_zero[2] = local_38.sa_data[8];
    addr_from.sin_zero[3] = local_38.sa_data[9];
    addr_from.sin_zero[4] = local_38.sa_data[10];
    addr_from.sin_zero[5] = local_38.sa_data[0xb];
    addr_from.sin_zero[6] = local_38.sa_data[0xc];
    addr_from.sin_zero[7] = local_38.sa_data[0xd];
    handle_left(addr_from);
    break;
  case 3:
    addr_from_00.sin_addr.s_addr._0_1_ = local_38.sa_data[2];
    addr_from_00.sin_addr.s_addr._1_1_ = local_38.sa_data[3];
    addr_from_00.sin_addr.s_addr._2_1_ = local_38.sa_data[4];
    addr_from_00.sin_addr.s_addr._3_1_ = local_38.sa_data[5];
    addr_from_00._0_4_ = local_38._0_4_;
    addr_from_00.sin_zero[0] = local_38.sa_data[6];
    addr_from_00.sin_zero[1] = local_38.sa_data[7];
    addr_from_00.sin_zero[2] = local_38.sa_data[8];
    addr_from_00.sin_zero[3] = local_38.sa_data[9];
    addr_from_00.sin_zero[4] = local_38.sa_data[10];
    addr_from_00.sin_zero[5] = local_38.sa_data[0xb];
    addr_from_00.sin_zero[6] = local_38.sa_data[0xc];
    addr_from_00.sin_zero[7] = local_38.sa_data[0xd];
    handle_parent_message(addr_from_00);
    break;
  case 4:
    recv_message();
    return 1;
  case 5:
    addr_from_01.sin_addr.s_addr._0_1_ = local_38.sa_data[2];
    addr_from_01.sin_addr.s_addr._1_1_ = local_38.sa_data[3];
    addr_from_01.sin_addr.s_addr._2_1_ = local_38.sa_data[4];
    addr_from_01.sin_addr.s_addr._3_1_ = local_38.sa_data[5];
    addr_from_01._0_4_ = local_38._0_4_;
    addr_from_01.sin_zero[0] = local_38.sa_data[6];
    addr_from_01.sin_zero[1] = local_38.sa_data[7];
    addr_from_01.sin_zero[2] = local_38.sa_data[8];
    addr_from_01.sin_zero[3] = local_38.sa_data[9];
    addr_from_01.sin_zero[4] = local_38.sa_data[10];
    addr_from_01.sin_zero[5] = local_38.sa_data[0xb];
    addr_from_01.sin_zero[6] = local_38.sa_data[0xc];
    addr_from_01.sin_zero[7] = local_38.sa_data[0xd];
    handle_child_message(addr_from_01);
    break;
  default:
    goto switchD_00103b8b_default;
  }
  send_good_message(local_40,local_3c);
switchD_00103b8b_default:
  return 1;
}

Assistant:

int recv_message() {
    struct sockaddr_in addr;
    socklen_t addr_size = sizeof(struct sockaddr_in);
    ssize_t size = recvfrom(socket_fd, buf, BUFFER_SIZE, 0, (struct sockaddr *) &addr, &addr_size);

    if (rand() % 99 + 1 < precent_lose) {
        fprintf(stderr, "Bwahaha you just lose new message: %d\n", precent_lose);
        return 0;
    }

    Ip_Port ip_port = get_ip_port(addr);
    int current_id;
    if (!idconnections.count(ip_port)) {
        idconnections[ip_port] = global_map_id;
        connections[global_map_id] = addr;
        current_id = global_map_id;
        ++global_map_id;
    }
    else {
        current_id = idconnections[ip_port];
    }

    if (size < 4) {
        fprintf(stderr, "Bad message size\n");
        return -1;
    }

    int type = (int)ntohl(((uint32_t*)buf)[0]);
    int id_message = (int)ntohl(((uint32_t*)buf)[1]);
    fprintf(stderr, "Type message: %d\n", type);

    if (received_messages[current_id].count(id_message)) {
        return 0;
    }
    else {
        auto cur_time = std::chrono::high_resolution_clock::now().time_since_epoch();
        long long ll_cur_time = std::chrono::duration_cast<std::chrono::microseconds>(cur_time).count();
        received_messages[current_id][id_message] = ll_cur_time;
    }

    if (GOODMSG == type) {
        delete_delivered_message(current_id, id_message);
        return 1;
    }

    if (CHILD == type) {
        handle_child_message(addr);
        send_good_message(current_id, id_message);
    }
    else if (PARENT == type) {
        handle_parent_message(addr);
        send_good_message(current_id, id_message);
    }
    else if (ROOT == type) {
        flag_root = true;
        fprintf(stderr, "!!! I am a root now\n");
        send_good_message(current_id, id_message);
    }
    else if (LEFT == type) {
        handle_left(addr);
        send_good_message(current_id, id_message);
    }
    else if (MSG == type) {
        int res = handle_message(addr, current_id);
        if (1 == res) {
            send_good_message(current_id, id_message);
        }
    }

    return 1;
}